

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  Vector3f *pVVar1;
  float *pfVar2;
  Float *pFVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  size_t sVar5;
  undefined1 auVar7 [16];
  ushort uVar8;
  undefined1 auVar9 [16];
  Point3fi *pPVar10;
  Point3fi *pPVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  HaltonSampler *this_00;
  DebugMLTSampler *this_01;
  Tuple3<pbrt::Vector3,_float> *w;
  PowerLightSampler *this_02;
  undefined1 auVar19 [16];
  Float FVar20;
  undefined1 auVar23 [16];
  undefined8 uVar22;
  float fVar21;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar34 [64];
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [56];
  undefined1 in_ZMM3 [64];
  Point3f PVar42;
  Vector3f woRender;
  Vector3f wiRender;
  Vector3f wiRender_00;
  SampledSpectrum SVar43;
  optional<pbrt::SampledLight> sampledLight;
  Float f_1;
  SampledSpectrum f;
  optional<pbrt::LightLiSample> ls;
  DispatchSplit<9> local_1e9;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  float local_1cc;
  Float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  Interval IStack_188;
  Tuple3<pbrt::Normal3,_float> TStack_180;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined4 local_15c;
  Interval local_158;
  Interval IStack_150;
  Interval IStack_148;
  undefined1 auStack_140 [16];
  undefined8 uStack_130;
  Interval *local_128;
  undefined8 *puStack_120;
  undefined8 *puStack_118;
  undefined4 *puStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  Tuple3<pbrt::Vector3,_float> local_e8;
  float fStack_dc;
  ulong local_d8;
  float local_d0;
  float local_cc;
  Interaction local_c8;
  char local_78;
  undefined8 local_68;
  anon_struct_8_0_00000001_for___align local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar33 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar35 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar40 [64];
  
  auVar23 = in_ZMM3._0_16_;
  IStack_188 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  local_1a8._8_8_ = local_1a8._0_8_;
  local_1a8._0_8_ = this;
  local_1b8._8_8_ = local_1b8._0_8_;
  local_1b8._0_8_ = lambda;
  pPVar10 = &(intr->super_Interaction).pi;
  pPVar11 = &(intr->super_Interaction).pi;
  local_198._0_4_ =
       (pPVar10->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  local_198._4_4_ =
       (pPVar10->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  local_198._8_4_ =
       (pPVar11->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  local_198._12_4_ =
       (pPVar11->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar35 = ZEXT856((ulong)(intr->super_Interaction).pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  TStack_180.x = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  TStack_180.y = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  TStack_180.z = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar4 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar6 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  fStack_16c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fStack_174 = (float)uVar4;
  fStack_170 = (float)uVar6;
  bVar13 = BSDF::HasReflection(bsdf);
  if ((!bVar13) || (bVar13 = BSDF::HasTransmission(bsdf), bVar13)) {
    bVar13 = BSDF::HasTransmission(bsdf);
    if ((bVar13) && (bVar13 = BSDF::HasReflection(bsdf), !bVar13)) {
      uVar16._0_4_ = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar16._4_4_ = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      w = &local_e8;
      auVar19._0_8_ = uVar16 ^ 0x8000000080000000;
      auVar19._8_4_ = 0x80000000;
      auVar19._12_4_ = 0x80000000;
      auVar35 = ZEXT856(auVar19._8_8_);
      local_e8.z = -(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_e8._0_8_ = vmovlps_avx(auVar19);
      goto LAB_003e38b9;
    }
  }
  else {
    w = &(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>;
LAB_003e38b9:
    PVar42 = Interaction::OffsetRayOrigin(&intr->super_Interaction,(Vector3f *)w);
    auVar37._0_4_ = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
    auVar24._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar24._8_56_ = auVar35;
    auVar37._4_4_ = auVar37._0_4_;
    auVar37._8_4_ = auVar37._0_4_;
    auVar37._12_4_ = auVar37._0_4_;
    local_198 = vshufps_avx(auVar24._0_16_,auVar24._0_16_,0x50);
    IStack_188 = (Interval)vmovlps_avx(auVar37);
  }
  local_e8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar20 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)&local_158,&local_e8,(ulong)local_e8._0_8_ >> 0x30);
  uVar16 = *(ulong *)(local_1a8._0_8_ + 0x58);
  if ((ushort)(uVar16 >> 0x30) < 3) {
    this_02 = (PowerLightSampler *)(uVar16 & 0xffffffffffff);
    if ((uVar16 & 0x3000000000000) == 0x2000000000000) {
      PowerLightSampler::Sample((optional<pbrt::SampledLight> *)local_1e8,this_02,FVar20);
    }
    else {
      sVar5 = (this_02->lights).nStored;
      if (sVar5 == 0) {
        local_1e8._0_12_ = ZEXT412(0);
        local_1e8._12_4_ = 0;
        local_1d8._0_1_ = false;
        local_1d8._1_7_ = 0;
        bVar13 = false;
      }
      else {
        auVar23 = vcvtusi2ss_avx512f(auVar23,sVar5);
        iVar14 = (int)sVar5 + -1;
        iVar17 = (int)(FVar20 * auVar23._0_4_);
        if (iVar17 <= iVar14) {
          iVar14 = iVar17;
        }
        bVar13 = true;
        local_1e8._8_4_ = 1.0 / auVar23._0_4_;
        local_1e8._0_8_ =
             (this_02->lights).ptr[iVar14].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
      }
      local_1d8._0_1_ = bVar13;
    }
  }
  else if ((uVar16 & 0xfffe000000000000) == 0x2000000000000) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1e8,
               (BVHLightSampler *)(uVar16 & 0xffffffffffff),(LightSampleContext *)local_198,FVar20);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1e8,
               (ExhaustiveLightSampler *)(uVar16 & 0xffffffffffff),(LightSampleContext *)local_198,
               FVar20);
  }
  uVar16 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar8 = (ushort)(uVar16 >> 0x30);
  uVar15 = (uint)uVar8;
  if (uVar16 >> 0x30 < 5) {
    if (uVar16 < 0x3000000000000) {
      if (uVar15 == 2) {
        auVar25._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar16 & 0xffffffffffff));
        auVar25._8_56_ = extraout_var_01;
        auVar23 = auVar25._0_16_;
      }
      else {
        auVar29._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar16 & 0xffffffffffff));
        auVar29._8_56_ = extraout_var_04;
        auVar23 = auVar29._0_16_;
      }
    }
    else {
      this_00 = (HaltonSampler *)(uVar16 & 0xffffffffffff);
      if ((uVar15 & 6) == 2) {
        iVar14 = 2;
        if (this_00->dimension < 999) {
          iVar14 = this_00->dimension;
        }
        this_00->dimension = iVar14 + 2;
        local_1c8 = HaltonSampler::SampleDimension(this_00,iVar14);
        uStack_1c4 = extraout_XMM0_Db;
        uStack_1c0 = extraout_XMM0_Dc;
        uStack_1bc = extraout_XMM0_Dd;
        auVar27._0_4_ = HaltonSampler::SampleDimension(this_00,iVar14 + 1);
        auVar27._4_60_ = extraout_var;
        auVar23 = auVar27._0_16_;
LAB_003e3d69:
        auVar9._4_4_ = uStack_1c4;
        auVar9._0_4_ = local_1c8;
        auVar9._8_4_ = uStack_1c0;
        auVar9._12_4_ = uStack_1bc;
        auVar23 = vinsertps_avx(auVar9,auVar23,0x10);
      }
      else {
        auVar31._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
        auVar31._8_56_ = extraout_var_06;
        auVar23 = auVar31._0_16_;
      }
    }
  }
  else {
    uVar18 = uVar8 - 4;
    if (uVar18 < 3) {
      if (uVar18 == 2) {
        auVar26._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar16 & 0xffffffffffff));
        auVar26._8_56_ = extraout_var_02;
        auVar23 = auVar26._0_16_;
      }
      else {
        auVar30._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar16 & 0xffffffffffff));
        auVar30._8_56_ = extraout_var_05;
        auVar23 = auVar30._0_16_;
      }
    }
    else {
      this_01 = (DebugMLTSampler *)(uVar16 & 0xffffffffffff);
      if (uVar15 - 6 < 2) {
        auVar28._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
        auVar28._8_56_ = extraout_var_03;
        auVar23 = auVar28._0_16_;
      }
      else {
        if (uVar15 - 6 != 2) {
          local_1c8 = DebugMLTSampler::Get1D(this_01);
          uStack_1c4 = extraout_XMM0_Db_00;
          uStack_1c0 = extraout_XMM0_Dc_00;
          uStack_1bc = extraout_XMM0_Dd_00;
          auVar34._0_4_ = DebugMLTSampler::Get1D(this_01);
          auVar34._4_60_ = extraout_var_00;
          auVar23 = auVar34._0_16_;
          goto LAB_003e3d69;
        }
        auVar32._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
        auVar32._8_56_ = extraout_var_07;
        auVar23 = auVar32._0_16_;
      }
    }
  }
  auVar19 = local_198;
  uVar22 = 0;
  uVar36 = 0;
  if (local_1d8._0_1_ != true) goto LAB_003e3d41;
  auStack_140._8_8_ = CONCAT44(fStack_174,TStack_180.z);
  uStack_130 = CONCAT44(fStack_16c,fStack_170);
  uVar12 = local_1e8._0_8_;
  puStack_120 = &local_68;
  puStack_110 = &local_15c;
  local_128 = &local_158;
  local_158.low = (Float)local_198._0_4_;
  local_158.high = (Float)local_198._4_4_;
  IStack_150.low = (Float)local_198._8_4_;
  IStack_150.high = (Float)local_198._12_4_;
  IStack_148 = IStack_188;
  auStack_140._0_4_ = TStack_180.x;
  auStack_140._4_4_ = TStack_180.y;
  local_58 = *(undefined8 *)local_1b8._0_8_;
  uStack_50 = *(undefined8 *)(local_1b8._0_8_ + 8);
  uStack_48 = *(undefined8 *)(local_1b8._0_8_ + 0x10);
  uStack_40 = *(undefined8 *)(local_1b8._0_8_ + 0x18);
  puStack_118 = &local_58;
  local_15c = 0;
  local_68 = vmovlps_avx(auVar23);
  local_60 = (anon_struct_8_0_00000001_for___align)local_1e8._0_8_;
  local_198 = auVar19;
  DispatchSplit<9>::operator()(&local_e8,&local_1e9,&local_60,(ulong)local_1e8._0_8_ >> 0x30);
  uVar22 = 0;
  if (local_78 == '\x01') {
    if ((local_e8.x == 0.0) && (!NAN(local_e8.x))) {
      uVar16 = 0xffffffffffffffff;
      do {
        if (uVar16 == 2) goto LAB_003e3d3d;
        pfVar2 = &local_e8.z + uVar16;
        uVar16 = uVar16 + 1;
      } while ((*pfVar2 == 0.0) && (!NAN(*pfVar2)));
      if (2 < uVar16) goto LAB_003e3d3d;
    }
    uVar36 = 0;
    if ((local_cc != 0.0) || (NAN(local_cc))) {
      local_1b8._8_8_ = 0;
      local_1b8._0_8_ = local_d8;
      pVVar1 = &(intr->super_Interaction).wo;
      local_108._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      local_108._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      local_1cc = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_f8 = vmovshdup_avx(local_1b8);
      uStack_100 = 0;
      local_1c8 = local_d0;
      auVar41 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar35 = ZEXT856(0);
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_d0;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_d8;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_d8._4_4_;
      SVar43 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,Radiance);
      auVar40._0_8_ = SVar43.values.values._8_8_;
      auVar40._8_56_ = auVar41;
      auVar33._0_8_ = SVar43.values.values._0_8_;
      auVar33._8_56_ = auVar35;
      fVar21 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar23 = vmovlhps_avx(auVar33._0_16_,auVar40._0_16_);
      auVar37 = ZEXT416((uint)(local_1c8 * fVar21));
      auVar19 = vfmadd132ss_fma(local_f8,auVar37,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y
                                       ));
      auVar37 = vfmsub213ss_fma(ZEXT416((uint)fVar21),ZEXT416((uint)local_1c8),auVar37);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar37._0_4_)),local_1b8,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x
                                       ));
      auVar38._0_4_ = auVar19._0_4_;
      auVar38._4_4_ = auVar38._0_4_;
      auVar38._8_4_ = auVar38._0_4_;
      auVar38._12_4_ = auVar38._0_4_;
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx512vl(auVar38,auVar7);
      local_158.low = auVar19._0_4_ * auVar23._0_4_;
      local_158.high = auVar19._4_4_ * auVar23._4_4_;
      IStack_150.low = auVar19._8_4_ * auVar23._8_4_;
      IStack_150.high = auVar19._12_4_ * auVar23._12_4_;
      if ((local_158.low == 0.0) && (!NAN(local_158.low))) {
        uVar16 = 0xffffffffffffffff;
        uVar22 = 0;
        do {
          if (uVar16 == 2) goto LAB_003e3d3d;
          pFVar3 = &IStack_150.low + uVar16;
          uVar16 = uVar16 + 1;
        } while ((*pFVar3 == 0.0) && (!NAN(*pFVar3)));
        uVar36 = 0;
        if (2 < uVar16) goto LAB_003e3d41;
      }
      if (local_78 == '\0') {
LAB_003e3e2d:
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      bVar13 = Integrator::Unoccluded
                         ((Integrator *)local_1a8._0_8_,&intr->super_Interaction,&local_c8);
      auVar23 = local_1b8;
      uVar22 = 0;
      uVar36 = 0;
      if (bVar13) {
        if ((local_1d8._0_1_ != true) || (local_78 == '\0')) goto LAB_003e3e2d;
        local_cc = (float)local_1e8._8_4_ * local_cc;
        if (*(uint *)(uVar12 & 0xffffffffffff) < 2) {
          auVar39._4_4_ = local_cc;
          auVar39._0_4_ = local_cc;
          auVar39._8_4_ = local_cc;
          auVar39._12_4_ = local_cc;
          auVar23._0_4_ = local_e8.x * local_158.low;
          auVar23._4_4_ = local_e8.y * local_158.high;
          auVar23._8_4_ = local_e8.z * IStack_150.low;
          auVar23._12_4_ = fStack_dc * IStack_150.high;
        }
        else {
          local_1a8 = ZEXT416((uint)local_cc);
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_1cc;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_108;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_1c8;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1b8._0_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
          local_1b8 = auVar23;
          FVar20 = BSDF::PDF(bsdf,woRender,wiRender_00,Radiance,All);
          if (local_78 == '\0') goto LAB_003e3e2d;
          fVar21 = ((float)local_1a8._0_4_ * (float)local_1a8._0_4_) /
                   ((float)local_1a8._0_4_ * (float)local_1a8._0_4_ + FVar20 * FVar20);
          auVar23._0_4_ = fVar21 * local_e8.x * local_158.low;
          auVar23._4_4_ = fVar21 * local_e8.y * local_158.high;
          auVar23._8_4_ = fVar21 * local_e8.z * IStack_150.low;
          auVar23._12_4_ = fVar21 * fStack_dc * IStack_150.high;
          auVar39._4_4_ = local_1a8._0_4_;
          auVar39._0_4_ = local_1a8._0_4_;
          auVar39._8_4_ = local_1a8._0_4_;
          auVar39._12_4_ = local_1a8._0_4_;
        }
        auVar23 = vdivps_avx(auVar23,auVar39);
        uVar22 = auVar23._0_8_;
        auVar23 = vshufpd_avx(auVar23,auVar23,1);
        uVar36 = auVar23._0_8_;
      }
    }
  }
  else {
LAB_003e3d3d:
    uVar22 = 0;
    uVar36 = 0;
  }
LAB_003e3d41:
  SVar43.values.values[2] = (float)(int)uVar36;
  SVar43.values.values[3] = (float)(int)((ulong)uVar36 >> 0x20);
  SVar43.values.values[0] = (float)(int)uVar22;
  SVar43.values.values[1] = (float)(int)((ulong)uVar22 >> 0x20);
  return (SampledSpectrum)SVar43.values.values;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF *bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Initialize _LightSampleContext_ for light sampling
    LightSampleContext ctx(intr);
    // Try to nudge the light sampling position to correct side of the surface
    if (bsdf->HasReflection() && !bsdf->HasTransmission())
        ctx.pi = intr.OffsetRayOrigin(intr.wo);
    else if (bsdf->HasTransmission() && !bsdf->HasReflection())
        ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};

    // Sample a point on the light source for direct lighting
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);
    pstd::optional<LightLiSample> ls =
        light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls->L || ls->pdf == 0)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls->wi;
    SampledSpectrum f = bsdf->f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls->pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls->pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls->L / lightPDF;
    else {
        Float bsdfPDF = bsdf->PDF(wo, wi);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls->L * weight / lightPDF;
    }
}